

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cumulativeCalendar.cpp
# Opt level: O0

int __thiscall
CumulativeCalProp::ttef_analyse_tasks_right_shift
          (CumulativeCalProp *this,int begin,int end,int dur_in,int task,int max_dur_lift,
          int *last_dur)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int *piVar4;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  int in_R9D;
  int *in_stack_00000008;
  int lct;
  int lst;
  int last_lst;
  int workDays;
  int end_in;
  int begin_in;
  int min_dur_in;
  int *tCal;
  int *wPeriods;
  int cal_idx;
  int lst0;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_18;
  int local_14 [4];
  int local_4;
  
  local_18 = in_EDX;
  local_14[0] = in_ESI;
  local_4 = max_start0((CumulativeCalProp *)
                       CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff8c);
  if (in_R9D < in_ECX) {
    piVar4 = vec<int>::operator[]((vec<int> *)(in_RDI + 0x80),in_R8D);
    lVar1 = *(long *)(*(long *)(in_RDI + 0xa0) + (long)(*piVar4 + -1) * 8);
    lVar2 = *(long *)(*(long *)(in_RDI + 0x98) + (long)(*piVar4 + -1) * 8);
    piVar4 = std::min<int>((int *)(*(long *)(in_RDI + 0x170) + (long)(int)in_R8D * 4),&local_18);
    piVar4 = std::max<int>(local_14,piVar4);
    local_50 = *piVar4;
    piVar4 = std::min<int>((int *)(*(long *)(in_RDI + 0x180) + (long)(int)in_R8D * 4),&local_18);
    if (*(int *)(in_RDI + 0x90) == 1) {
      local_50 = *piVar4 - local_50;
    }
    else {
      local_50 = *(int *)(lVar1 + (long)local_50 * 4) - *(int *)(lVar1 + (long)*piVar4 * 4);
    }
    local_54 = *(int *)(*(long *)(in_RDI + 0x170) + (long)(int)in_R8D * 4);
    *in_stack_00000008 = local_50;
    local_58 = *(int *)(*(long *)(in_RDI + 0x170) + (long)(int)in_R8D * 4);
    local_5c = *(int *)(*(long *)(in_RDI + 0x180) + (long)(int)in_R8D * 4);
    while (local_58 = local_58 + 1, local_58 <= local_4) {
      if (local_14[0] <= local_54) {
        local_50 = local_50 + -1;
      }
      for (; *(int *)(lVar2 + (long)local_58 * 4) == 0 && local_58 <= local_4;
          local_58 = local_58 + 1) {
        if ((*(int *)(in_RDI + 0x90) == 1) && (local_14[0] <= local_58)) {
          local_50 = local_50 + -1;
        }
      }
      iVar3 = local_5c;
      if (local_4 < local_58) {
        return local_54;
      }
      while (local_5c = iVar3 + 1, *(int *)(lVar2 + (long)iVar3 * 4) == 0) {
        iVar3 = local_5c;
        if ((*(int *)(in_RDI + 0x90) == 1) && (local_5c <= local_18)) {
          local_50 = local_50 + 1;
        }
      }
      if (local_5c <= local_18) {
        local_50 = local_50 + 1;
      }
      if (local_50 < in_ECX - in_R9D) {
        return local_54;
      }
      local_54 = local_58;
      *in_stack_00000008 = local_50;
    }
    local_4 = local_54;
  }
  else {
    *in_stack_00000008 = 0;
  }
  return local_4;
}

Assistant:

int CumulativeCalProp::ttef_analyse_tasks_right_shift(const int begin, const int end,
																											const int dur_in, const int task,
																											const int max_dur_lift, int& last_dur) {
	// Some assumptions
	assert(est_2[task] < end && begin < lct_2[task]);

	// Defining some constants
	const int lst0 = max_start0(task);
	if (dur_in <= max_dur_lift) {
		last_dur = 0;
		return lst0;
	}
	// Defining more constants
	const int cal_idx = taskCalendar[task] - 1;
	const int* wPeriods = workingPeriods[cal_idx];
	const int* tCal = calendar[cal_idx];
	const int min_dur_in = dur_in - max_dur_lift;
	const int begin_in = std::max(begin, std::min(lst_2[task], end));
	const int end_in = std::min(lct_2[task], end);
	// Defining some variables
	int workDays = (rho == 1 ? end_in - begin_in : wPeriods[begin_in] - wPeriods[end_in]);
	int last_lst = lst_2[task];
	last_dur = workDays;
	int lst = lst_2[task] + 1;
	int lct = lct_2[task] + 1;

	assert(workDays >= dur_in);

	// Determining the latest possible start time and the number of workDays in the time window
	// [begin, end)
	for (; lst <= lst0; lst++, lct++) {
		if (last_lst >= begin) {
			workDays--;
		}
		// Determining the new start time
		assert(tCal[lst - 1] == 1);
		while (tCal[lst] == 0 && lst <= lst0) {
			if (rho == 1 && lst >= begin) {
				workDays--;
			}
			lst++;
		}
		if (lst > lst0) {
			return last_lst;
		}
		// Determining the new end time
		assert(tCal[lct - 2] == 1);
		while (tCal[lct - 1] == 0) {
			if (rho == 1 && lct <= end) {
				workDays++;
			}
			lct++;
		}
		if (lct <= end) {
			workDays++;
		}
		// Check the number of working days in the time window [begin, end)
		if (workDays < min_dur_in) {
			return last_lst;
		}
		// Saving valid shift
		last_lst = lst;
		last_dur = workDays;

		// Some cross checks
		assert(min_dur(task) == wPeriods[last_lst] - wPeriods[lct]);
		assert(rho == 0 || workDays == std::min(end, lct) - std::max(begin, last_lst));
		assert(rho == 1 ||
					 workDays == wPeriods[std::max(begin, last_lst)] - wPeriods[std::min(end, lct)]);
		assert(ttef_analyse_tasks_check_expl_ub(begin, end, task, min_dur_in, last_lst));
	}
	return last_lst;
}